

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

SynVariableDefinition * ParseVariableDefinition(ParseContext *ctx)

{
  uint uVar1;
  Lexeme *begin;
  char *pcVar2;
  int iVar3;
  undefined4 extraout_var;
  SynBase *this_00;
  undefined4 extraout_var_00;
  SynVariableDefinition *this_01;
  Lexeme *pLVar4;
  SynIdentifier *this;
  undefined4 extraout_var_01;
  
  begin = ctx->currentLexeme;
  if (begin->type != lex_string) {
    return (SynVariableDefinition *)0x0;
  }
  pcVar2 = begin->pos;
  uVar1 = begin->length;
  ctx->currentLexeme = begin + 1;
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
  this = (SynIdentifier *)CONCAT44(extraout_var,iVar3);
  if (ctx->firstLexeme < ctx->currentLexeme) {
    pLVar4 = ctx->currentLexeme + -1;
    SynBase::SynBase((SynBase *)this,4,pLVar4,pLVar4);
    (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_0023f0c0;
    (this->name).begin = pcVar2;
    (this->name).end = pcVar2 + uVar1;
    pLVar4 = ctx->currentLexeme;
    if (0x7ff < uVar1) {
      anon_unknown.dwarf_151f2::Stop
                (ctx,pLVar4,"ERROR: variable name length is limited to %d symbols",0x800);
    }
    if (pLVar4->type == lex_set) {
      ctx->currentLexeme = pLVar4 + 1;
      this_00 = ParseAssignment(ctx);
      if (this_00 == (SynBase *)0x0) {
        anon_unknown.dwarf_151f2::Report
                  (ctx,ctx->currentLexeme,"ERROR: expression not found after \'=\'");
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])();
        this_00 = (SynBase *)CONCAT44(extraout_var_00,iVar3);
        SynBase::SynBase(this_00,0,ctx->currentLexeme,ctx->currentLexeme);
        this_00->_vptr_SynBase = (_func_int **)&PTR__SynBase_0023f208;
      }
    }
    else {
      this_00 = (SynBase *)0x0;
    }
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    this_01 = (SynVariableDefinition *)CONCAT44(extraout_var_01,iVar3);
    if (ctx->firstLexeme < ctx->currentLexeme) {
      SynBase::SynBase((SynBase *)this_01,0x33,begin,ctx->currentLexeme + -1);
      (this_01->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_0023fd30;
      this_01->name = this;
      this_01->initializer = this_00;
      return this_01;
    }
  }
  __assert_fail("currentLexeme > firstLexeme",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                ,0x19c,"Lexeme *ParseContext::Previous()");
}

Assistant:

SynVariableDefinition* ParseVariableDefinition(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.At(lex_string))
	{
		InplaceStr name = ctx.Consume();
		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);

		if(name.length() >= NULLC_MAX_VARIABLE_NAME_LENGTH)
			Stop(ctx, ctx.Current(), "ERROR: variable name length is limited to %d symbols", NULLC_MAX_VARIABLE_NAME_LENGTH);

		SynBase *initializer = NULL;

		if(ctx.Consume(lex_set))
		{
			initializer = ParseAssignment(ctx);

			if(!initializer)
			{
				Report(ctx, ctx.Current(), "ERROR: expression not found after '='");

				initializer = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}
		}

		return new (ctx.get<SynVariableDefinition>()) SynVariableDefinition(start, ctx.Previous(), nameIdentifier, initializer);
	}

	return NULL;
}